

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall AddrManImpl::ClearNew(AddrManImpl *this,int nUBucket,int nUBucketPos)

{
  long lVar1;
  bool bVar2;
  mapped_type *this_00;
  Level level;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  nid_type nIdDelete;
  int nUBucketPos_local;
  int nUBucket_local;
  string local_48;
  long local_28;
  
  level = (Level)&nIdDelete;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->vvNew[nUBucket][nUBucketPos];
  nUBucketPos_local = nUBucketPos;
  nUBucket_local = nUBucket;
  if (lVar1 != -1) {
    nIdDelete = lVar1;
    this_00 = std::__detail::
              _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->mapInfo,&nIdDelete);
    if (this_00->nRefCount < 1) {
      __assert_fail("infoDelete.nRefCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1e1,"void AddrManImpl::ClearNew(int, int)");
    }
    this_00->nRefCount = this_00->nRefCount + -1;
    this->vvNew[nUBucket][nUBucketPos] = -1;
    bVar2 = ::LogAcceptCategory(ADDRMAN,level);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_(&local_48,(CService *)this_00);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
      ;
      source_file._M_len = 0x5b;
      logging_function._M_str = "ClearNew";
      logging_function._M_len = 8;
      LogPrintFormatInternal<std::__cxx11::string,int,int>
                (logging_function,source_file,0x1e4,ADDRMAN,Debug,
                 (ConstevalFormatString<3U>)0xc8bc6b,&local_48,&nUBucket_local,&nUBucketPos_local);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (this_00->nRefCount == 0) {
      Delete(this,nIdDelete);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::ClearNew(int nUBucket, int nUBucketPos)
{
    AssertLockHeld(cs);

    // if there is an entry in the specified bucket, delete it.
    if (vvNew[nUBucket][nUBucketPos] != -1) {
        nid_type nIdDelete = vvNew[nUBucket][nUBucketPos];
        AddrInfo& infoDelete = mapInfo[nIdDelete];
        assert(infoDelete.nRefCount > 0);
        infoDelete.nRefCount--;
        vvNew[nUBucket][nUBucketPos] = -1;
        LogDebug(BCLog::ADDRMAN, "Removed %s from new[%i][%i]\n", infoDelete.ToStringAddrPort(), nUBucket, nUBucketPos);
        if (infoDelete.nRefCount == 0) {
            Delete(nIdDelete);
        }
    }
}